

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O1

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::move_next(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  bool bVar4;
  bool bVar5;
  
  if (this->at_start_ == true) {
    this->at_start_ = false;
    if (this->tree_size != 0) {
      pnVar3 = this->tree_root;
      do {
        pnVar2 = pnVar3;
        pnVar3 = pnVar2->left;
      } while (pnVar3 != this->NIL);
      this->current_element = pnVar2;
      return true;
    }
  }
  else {
    pnVar3 = this->current_element;
    if (pnVar3 != (node *)0x0) {
      pnVar2 = this->NIL;
      bVar4 = pnVar3->right == pnVar2;
      if (bVar4) {
        pnVar1 = pnVar3->parent;
        if (pnVar1 == pnVar2) {
          pnVar3 = (node *)0x0;
          bVar5 = false;
        }
        else {
          bVar5 = pnVar1->left == pnVar3;
          pnVar3 = pnVar1;
        }
        this->current_element = pnVar3;
        if (pnVar1 == pnVar2) {
          return false;
        }
      }
      else {
        this->current_element = pnVar3->right;
        bVar5 = false;
      }
      pnVar3 = this->current_element;
      do {
        while (!bVar4) {
          pnVar3 = pnVar3->left;
          if (pnVar3 == pnVar2) {
            return true;
          }
          this->current_element = pnVar3;
          bVar4 = false;
        }
        if (bVar5) {
          return true;
        }
        pnVar1 = pnVar3->parent;
        bVar5 = pnVar1->left == pnVar3;
        this->current_element = pnVar1;
        pnVar3 = pnVar1;
      } while (pnVar1 != pnVar2);
      this->current_element = (node *)0x0;
    }
  }
  return false;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    move_next (
    ) const
    {
        // if we haven't started iterating yet
        if (at_start_)
        {
            at_start_ = false;
            if (tree_size == 0)
            {
                return false;
            }
            else
            {
                // find the first element in the tree
                current_element = tree_root;
                node* temp = current_element->left;
                while (temp != NIL)
                {
                    current_element = temp;
                    temp = current_element->left;
                }
                return true;
            }
        }
        else
        {
            if (current_element == 0)
            {
                return false;
            }
            else
            {
                bool went_up;  // true if we went up the tree from a child node to parent
                bool from_left = false; // true if we went up and were coming from a left child node
                // find the next element in the tree
                if (current_element->right != NIL)
                {
                    // go right and down                    
                    current_element = current_element->right;
                    went_up = false;
                }
                else
                {
                    went_up = true;
                    node* parent = current_element->parent;
                    if (parent == NIL)
                    {
                        // in this case we have iterated over all the element of the tree
                        current_element = 0;
                        return false;
                    }

                    from_left = (parent->left == current_element);
                    // go up to parent
                    current_element = parent;
                }


                while (true)
                {
                    if (went_up)
                    {
                        if (from_left)
                        {
                            // in this case we have found the next node
                            break;
                        }
                        else
                        {
                            // we should go up
                            node* parent = current_element->parent;
                            from_left = (parent->left == current_element);                            
                            current_element = parent;
                            if (current_element == NIL)
                            {
                                // in this case we have iterated over all the elements
                                // in the tree
                                current_element = 0;
                                return false;
                            }
                        }
                    }
                    else
                    {
                        // we just went down to a child node
                        if (current_element->left != NIL)
                        {
                            // go left
                            went_up = false;
                            current_element = current_element->left;
                        }
                        else
                        {
                            // if there is no left child then we have found the next node
                            break;
                        }
                    }
                }

                return true;               
            }
        }
    }